

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::UninterpretedOption::ByteSizeLong(UninterpretedOption *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  UnknownFieldSet *unknown_fields;
  UninterpretedOption_NamePart *value;
  size_t sVar4;
  string *psVar5;
  uint64 value_00;
  int64 value_01;
  uint local_40;
  int cached_size;
  uint i;
  uint count;
  size_t total_size;
  UninterpretedOption *this_local;
  
  _i = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = UninterpretedOption::unknown_fields(this);
    _i = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar2 = name_size(this);
  _i = uVar2 + _i;
  for (local_40 = 0; local_40 < uVar2; local_40 = local_40 + 1) {
    value = name(this,local_40);
    sVar4 = internal::WireFormatLite::
            MessageSizeNoVirtual<google::protobuf::UninterpretedOption_NamePart>(value);
    _i = sVar4 + _i;
  }
  if (((this->_has_bits_).has_bits_[0] & 0x3f) != 0) {
    bVar1 = has_identifier_value(this);
    if (bVar1) {
      psVar5 = identifier_value_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(psVar5);
      _i = sVar4 + 1 + _i;
    }
    bVar1 = has_string_value(this);
    if (bVar1) {
      psVar5 = string_value_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::BytesSize(psVar5);
      _i = sVar4 + 1 + _i;
    }
    bVar1 = has_aggregate_value(this);
    if (bVar1) {
      psVar5 = aggregate_value_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(psVar5);
      _i = sVar4 + 1 + _i;
    }
    bVar1 = has_positive_int_value(this);
    if (bVar1) {
      value_00 = positive_int_value(this);
      sVar4 = internal::WireFormatLite::UInt64Size(value_00);
      _i = sVar4 + 1 + _i;
    }
    bVar1 = has_negative_int_value(this);
    if (bVar1) {
      value_01 = negative_int_value(this);
      sVar4 = internal::WireFormatLite::Int64Size(value_01);
      _i = sVar4 + 1 + _i;
    }
    bVar1 = has_double_value(this);
    if (bVar1) {
      _i = _i + 9;
    }
  }
  iVar3 = internal::ToCachedSize(_i);
  this->_cached_size_ = iVar3;
  return _i;
}

Assistant:

size_t UninterpretedOption::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.UninterpretedOption)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
  {
    unsigned int count = this->name_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->name(i));
    }
  }

  if (_has_bits_[0 / 32] & 63u) {
    // optional string identifier_value = 3;
    if (has_identifier_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->identifier_value());
    }

    // optional bytes string_value = 7;
    if (has_string_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::BytesSize(
          this->string_value());
    }

    // optional string aggregate_value = 8;
    if (has_aggregate_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->aggregate_value());
    }

    // optional uint64 positive_int_value = 4;
    if (has_positive_int_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt64Size(
          this->positive_int_value());
    }

    // optional int64 negative_int_value = 5;
    if (has_negative_int_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int64Size(
          this->negative_int_value());
    }

    // optional double double_value = 6;
    if (has_double_value()) {
      total_size += 1 + 8;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}